

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfactoryloader.cpp
# Opt level: O0

void __thiscall
QFactoryLoader::QFactoryLoader(QFactoryLoader *this,char *iid,QString *suffix,CaseSensitivity cs)

{
  long lVar1;
  Private *pPVar2;
  CaseSensitivity in_ECX;
  Private *in_RDI;
  long in_FS_OFFSET;
  QMutexLocker<QRecursiveMutex> locker;
  QRecursiveMutex *in_stack_ffffffffffffff58;
  QMutexLocker<QRecursiveMutex> *in_stack_ffffffffffffff60;
  Private *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffffc8;
  CaseSensitivity CVar3;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Private::Private(in_stack_ffffffffffffff80);
  Private::operator->(in_RDI);
  QByteArray::operator=
            ((QByteArray *)in_stack_ffffffffffffff58,
             (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  CVar3 = in_ECX;
  pPVar2 = Private::operator->(in_RDI);
  pPVar2->cs = in_ECX;
  Private::operator->(in_RDI);
  QString::operator=((QString *)in_stack_ffffffffffffff60,(QString *)in_stack_ffffffffffffff58);
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>_>::
  operator->((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>_>
              *)0x4439c2);
  QMutexLocker<QRecursiveMutex>::QMutexLocker(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  update((QFactoryLoader *)CONCAT44(CVar3,in_stack_ffffffffffffffc8));
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>_>::
  operator->((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_factoryloader_global>_>
              *)0x4439f3);
  QList<QFactoryLoader_*>::append
            ((QList<QFactoryLoader_*> *)0x443a0d,(parameter_type)in_stack_ffffffffffffff58);
  QMutexLocker<QRecursiveMutex>::~QMutexLocker(in_stack_ffffffffffffff60);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QFactoryLoader::QFactoryLoader(const char *iid,
                               const QString &suffix,
                               Qt::CaseSensitivity cs)
{
    Q_ASSERT_X(suffix.startsWith(u'/'), "QFactoryLoader",
               "For historical reasons, the suffix must start with '/' (and it can't be empty)");

    d->iid = iid;
#if QT_CONFIG(library)
    d->cs = cs;
    d->suffix = suffix;
# ifdef Q_OS_ANDROID
    if (!d->suffix.isEmpty() && d->suffix.at(0) == u'/')
        d->suffix.remove(0, 1);
# endif

    QMutexLocker locker(&qt_factoryloader_global->mutex);
    update();
    qt_factoryloader_global->loaders.append(this);
#else
    Q_UNUSED(suffix);
    Q_UNUSED(cs);
#endif
}